

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

double CoordDistance(double lat1,double lon1,double lat2,double lon2)

{
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  undefined4 in_XMM3_Da;
  undefined4 in_XMM3_Db;
  double y;
  double x;
  
  dVar1 = (in_XMM0_Qa * 3.141592653589793) / 180.0;
  dVar2 = (in_XMM2_Qa * 3.141592653589793) / 180.0;
  dVar3 = sin((dVar2 - dVar1) / 2.0);
  dVar4 = sin((((double)CONCAT44(in_XMM3_Db,in_XMM3_Da) * 3.141592653589793) / 180.0 -
              (in_XMM1_Qa * 3.141592653589793) / 180.0) / 2.0);
  dVar1 = cos(dVar1);
  dVar2 = cos(dVar2);
  dVar1 = sqrt(dVar3 * dVar3 + dVar1 * dVar2 * dVar4 * dVar4);
  dVar1 = asin(dVar1);
  return dVar1 * 12742000.0;
}

Assistant:

double CoordDistance (double lat1, double lon1, double lat2, double lon2)
{
    lat1 *= PI; lat1 /= 180.0;              // in-place degree-to-rad conversion
    lon1 *= PI; lon1 /= 180.0;
    lat2 *= PI; lat2 /= 180.0;
    lon2 *= PI; lon2 /= 180.0;

    using namespace std;
    const double x = sin((lat2 - lat1) / 2);
    const double y = sin((lon2 - lon1) / 2);
    return EARTH_D_M * asin(sqrt((x * x) + (cos(lat1) * cos(lat2) * y * y)));
}